

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

LPCSTR __thiscall Func::GetVtableName(Func *this,INT_PTR address)

{
  Type piVar1;
  uint uVar2;
  int iVar3;
  VtableHashMap *pVVar4;
  LPCSTR pCVar5;
  char *__s1;
  Type this_00;
  uint uVar6;
  
  if (this->vtableMap == (VtableHashMap *)0x0) {
    pVVar4 = VirtualTableRegistry::CreateVtableHashMap(&this->m_alloc->super_ArenaAllocator);
    this->vtableMap = pVVar4;
  }
  pVVar4 = this->vtableMap;
  piVar1 = pVVar4->buckets;
  uVar2 = 0;
  if (piVar1 != (Type)0x0) {
    uVar2 = JsUtil::
            BaseDictionary<long,_const_char_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((int)address * 2 + 1,pVVar4->bucketCount,pVVar4->modFunctionIndex);
    uVar6 = piVar1[uVar2];
    uVar2 = 0;
    if (-1 < (int)uVar6) {
      uVar2 = 0;
      do {
        if (pVVar4->entries[uVar6].
            super_DefaultHashedEntry<long,_const_char_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<long,_const_char_*>.
            super_ValueEntry<const_char_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_const_char_*>_>
            .super_KeyValueEntryDataLayout2<long,_const_char_*>.key == address) {
          this_00 = pVVar4->stats;
          goto LAB_00431268;
        }
        uVar2 = uVar2 + 1;
        uVar6 = pVVar4->entries[uVar6].
                super_DefaultHashedEntry<long,_const_char_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<long,_const_char_*>.
                super_ValueEntry<const_char_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_const_char_*>_>
                .super_KeyValueEntryDataLayout2<long,_const_char_*>.next;
      } while (-1 < (int)uVar6);
    }
  }
  this_00 = pVVar4->stats;
  uVar6 = 0xffffffff;
LAB_00431268:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar2);
  }
  if ((int)uVar6 < 0) {
    __s1 = (char *)0x0;
  }
  else {
    __s1 = pVVar4->entries[uVar6].
           super_DefaultHashedEntry<long,_const_char_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
           .super_KeyValueEntry<long,_const_char_*>.
           super_ValueEntry<const_char_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_const_char_*>_>
           .super_KeyValueEntryDataLayout2<long,_const_char_*>.value;
  }
  if (__s1 == (char *)0x0) {
    pCVar5 = (LPCSTR)0x0;
  }
  else {
    iVar3 = strncmp(__s1,"class ",6);
    pCVar5 = __s1 + 6;
    if (iVar3 != 0) {
      pCVar5 = __s1;
    }
  }
  return pCVar5;
}

Assistant:

LPCSTR
Func::GetVtableName(INT_PTR address)
{
#if DBG
    if (vtableMap == nullptr)
    {
        vtableMap = VirtualTableRegistry::CreateVtableHashMap(this->m_alloc);
    };
    LPCSTR name = vtableMap->Lookup(address, nullptr);
    if (name)
    {
         if (strncmp(name, "class ", _countof("class ") - 1) == 0)
         {
             name += _countof("class ") - 1;
         }
    }
    return name;
#else
    return "";
#endif
}